

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O3

int run_test_udp_connect(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  long lVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 unaff_RBX;
  int iVar4;
  uv_udp_t *puVar5;
  sockaddr_in *psVar6;
  uv_buf_t *puVar7;
  char *pcVar8;
  uv_udp_t *puVar9;
  sockaddr_in ext_addr;
  int addrlen;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  undefined1 local_170 [40];
  uv_udp_t local_148;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&server);
    if (iVar1 != 0) goto LAB_00187191;
    iVar1 = uv_udp_bind(&server,&lo_addr,0);
    if (iVar1 != 0) goto LAB_00187196;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    if (iVar1 != 0) goto LAB_0018719b;
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&client);
    if (iVar1 != 0) goto LAB_001871a0;
    buf = (uv_buf_t)uv_buf_init("EXIT",4);
    local_148.data = (void *)0x0;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_170 + 0x18);
    local_170._0_8_ = SEXT48(iVar1);
    if (local_148.data != (void *)local_170._0_8_) goto LAB_001871a5;
    iVar1 = uv_udp_connect(&client,local_170 + 0x18);
    local_148.data = (void *)(long)iVar1;
    local_170._0_8_ = (void *)0x0;
    if (local_148.data != (void *)0x0) goto LAB_001871b4;
    iVar1 = uv_udp_connect(&client,0);
    local_148.data = (void *)(long)iVar1;
    local_170._0_8_ = (void *)0x0;
    if (local_148.data != (void *)0x0) goto LAB_001871c3;
    pcVar8 = "8.8.8.8";
    puVar5 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,local_170);
    puVar9 = (uv_udp_t *)pcVar8;
    if (iVar1 != 0) goto LAB_001871d2;
    puVar9 = (uv_udp_t *)0x1a4e6a;
    puVar5 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
    if (iVar1 != 0) goto LAB_001871d7;
    puVar9 = &client;
    psVar6 = &lo_addr;
    iVar1 = uv_udp_connect();
    puVar5 = (uv_udp_t *)psVar6;
    if (iVar1 != 0) goto LAB_001871dc;
    puVar9 = &client;
    puVar5 = (uv_udp_t *)local_170;
    iVar1 = uv_udp_connect();
    if (iVar1 != -0x6a) goto LAB_001871e1;
    local_170._20_4_ = 0x10;
    puVar9 = &client;
    puVar5 = (uv_udp_t *)(local_170 + 0x18);
    iVar1 = uv_udp_getpeername();
    if (iVar1 != 0) goto LAB_001871e6;
    puVar9 = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,&lo_addr);
    puVar5 = (uv_udp_t *)puVar7;
    if (iVar1 != -0x6a) goto LAB_001871eb;
    puVar9 = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,0);
    puVar5 = (uv_udp_t *)puVar7;
    if (iVar1 != 4) goto LAB_001871f0;
    puVar9 = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,local_170);
    puVar5 = (uv_udp_t *)puVar7;
    if (iVar1 != -0x6a) goto LAB_001871f5;
    puVar9 = &client;
    puVar5 = (uv_udp_t *)0x0;
    iVar1 = uv_udp_connect();
    if (iVar1 != 0) goto LAB_001871fa;
    puVar9 = &client;
    puVar5 = (uv_udp_t *)0x0;
    iVar1 = uv_udp_connect();
    if (iVar1 != -0x6b) goto LAB_001871ff;
    local_170._20_4_ = 0x10;
    puVar9 = &client;
    puVar5 = (uv_udp_t *)(local_170 + 0x18);
    iVar1 = uv_udp_getpeername();
    if (iVar1 != -0x6b) goto LAB_00187204;
    puVar9 = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,&lo_addr);
    puVar5 = (uv_udp_t *)puVar7;
    if (iVar1 != 4) goto LAB_00187209;
    puVar9 = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,0);
    puVar5 = (uv_udp_t *)puVar7;
    if (iVar1 != -0x59) goto LAB_0018720e;
    puVar9 = &client;
    psVar6 = &lo_addr;
    iVar1 = uv_udp_connect();
    puVar5 = (uv_udp_t *)psVar6;
    if (iVar1 != 0) goto LAB_00187213;
    puVar5 = &client;
    puVar9 = &local_148;
    iVar1 = uv_udp_send(puVar9,&client,&buf,1,&lo_addr,cl_send_cb);
    if (iVar1 != -0x6a) goto LAB_00187218;
    puVar5 = &client;
    puVar9 = &local_148;
    iVar1 = uv_udp_send(puVar9,&client,&buf,1,0,cl_send_cb);
    if (iVar1 != 0) goto LAB_0018721d;
    puVar9 = (uv_udp_t *)uv_default_loop();
    puVar5 = (uv_udp_t *)0x0;
    uv_run();
    if (close_cb_called != 2) goto LAB_00187222;
    if (sv_recv_cb_called != 4) goto LAB_00187227;
    if (cl_send_cb_called != 2) goto LAB_0018722c;
    if (client.send_queue_size != 0) goto LAB_00187231;
    if (server.send_queue_size != 0) goto LAB_00187236;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    puVar5 = (uv_udp_t *)0x0;
    uv_run(unaff_RBX);
    puVar9 = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_connect_cold_1();
LAB_00187191:
    run_test_udp_connect_cold_2();
LAB_00187196:
    run_test_udp_connect_cold_3();
LAB_0018719b:
    run_test_udp_connect_cold_4();
LAB_001871a0:
    run_test_udp_connect_cold_5();
LAB_001871a5:
    run_test_udp_connect_cold_6();
LAB_001871b4:
    run_test_udp_connect_cold_7();
LAB_001871c3:
    puVar9 = &local_148;
    puVar5 = (uv_udp_t *)local_170;
    run_test_udp_connect_cold_8();
LAB_001871d2:
    run_test_udp_connect_cold_9();
LAB_001871d7:
    run_test_udp_connect_cold_10();
LAB_001871dc:
    run_test_udp_connect_cold_11();
LAB_001871e1:
    run_test_udp_connect_cold_12();
LAB_001871e6:
    run_test_udp_connect_cold_13();
LAB_001871eb:
    run_test_udp_connect_cold_14();
LAB_001871f0:
    run_test_udp_connect_cold_15();
LAB_001871f5:
    run_test_udp_connect_cold_16();
LAB_001871fa:
    run_test_udp_connect_cold_17();
LAB_001871ff:
    run_test_udp_connect_cold_18();
LAB_00187204:
    run_test_udp_connect_cold_19();
LAB_00187209:
    run_test_udp_connect_cold_20();
LAB_0018720e:
    run_test_udp_connect_cold_21();
LAB_00187213:
    run_test_udp_connect_cold_22();
LAB_00187218:
    run_test_udp_connect_cold_23();
LAB_0018721d:
    run_test_udp_connect_cold_24();
LAB_00187222:
    run_test_udp_connect_cold_25();
LAB_00187227:
    run_test_udp_connect_cold_26();
LAB_0018722c:
    run_test_udp_connect_cold_27();
LAB_00187231:
    run_test_udp_connect_cold_28();
LAB_00187236:
    run_test_udp_connect_cold_29();
  }
  run_test_udp_connect_cold_30();
  lVar3 = CONCAT71(0x53e6,puVar9 == &client || puVar9 == &server);
  if (puVar9 == &client || puVar9 == &server) {
    if (puVar5 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)puVar5 < 1) {
    return extraout_EAX_00;
  }
  if (puVar5 == (uv_udp_t *)0x4) {
    if (lVar3 == 0) goto LAB_001872e2;
    if (*(int *)*extraout_RDX_00 == 0x54495845) {
      sv_recv_cb_called = sv_recv_cb_called + 1;
      if (sv_recv_cb_called != 4) {
        return sv_recv_cb_called;
      }
      uv_close(&server,close_cb);
      iVar1 = uv_close(&client,close_cb);
      return iVar1;
    }
  }
  else {
    sv_recv_cb_cold_1();
LAB_001872e2:
    sv_recv_cb_cold_3();
  }
  iVar4 = (int)puVar5;
  sv_recv_cb_cold_2();
  iVar1 = cl_send_cb_called;
  if (puVar9 == (uv_udp_t *)0x0) {
    cl_send_cb_cold_5();
LAB_001873ae:
    cl_send_cb_cold_1();
LAB_001873b3:
    cl_send_cb_cold_2();
    puVar5 = puVar9;
  }
  else {
    if (iVar4 != 0) goto LAB_001873ae;
    if ((uv_udp_t *)(puVar9->u).reserved[2] != &client &&
        (uv_udp_t *)(puVar9->u).reserved[2] != &server) goto LAB_001873b3;
    if (cl_send_cb_called != 0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return iVar1;
    }
    cl_send_cb_called = cl_send_cb_called + 1;
    uVar2 = extraout_RAX;
    uv_udp_connect(&client,0);
    puVar5 = puVar9;
    iVar1 = uv_udp_send(puVar9,&client,&buf,1,0,cl_send_cb,uVar2,unaff_RBX);
    if (iVar1 == -0x59) {
      iVar1 = uv_udp_send(puVar9,&client,&buf,1,&lo_addr,cl_send_cb,uVar2,unaff_RBX);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001873bd;
    }
  }
  puVar9 = puVar5;
  cl_send_cb_cold_3();
LAB_001873bd:
  cl_send_cb_cold_4();
  if (puVar9 == &client || puVar9 == &server) {
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_01;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar9,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__PASE__)
  RETURN_SKIP(
      "IBMi PASE's UDP connection can not be disconnected with AF_UNSPEC.");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows wih WSAEADDRNOTAVAIL */
  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_EQ(r, 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, 0);
#endif

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}